

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

RequestBuilder * __thiscall restincurl::RequestBuilder::WithJson(RequestBuilder *this,string *body)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RequestBuilder *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Header(this,"Content-type: Application/json; charset=utf-8");
  local_38._M_dataplus._M_p = (body->_M_dataplus)._M_p;
  paVar1 = &body->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == paVar1) {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_38.field_2._8_8_ = *(undefined8 *)((long)&body->field_2 + 8);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    local_38.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38._M_string_length = body->_M_string_length;
  (body->_M_dataplus)._M_p = (pointer)paVar1;
  body->_M_string_length = 0;
  (body->field_2)._M_local_buf[0] = '\0';
  pRVar2 = SendData<std::__cxx11::string>(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pRVar2;
}

Assistant:

RequestBuilder& WithJson(std::string body) {
            WithJson();
            return SendData(std::move(body));
        }